

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O3

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::load_data(segment_impl<ELFIO::Elf32_Phdr> *this)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  const_iterator __begin2;
  undefined4 extraout_var;
  pointer paVar5;
  ulong uVar6;
  char *pcVar7;
  long *plVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  undefined4 extraout_var_00;
  
  iVar4 = (*(this->super_segment)._vptr_segment[3])();
  if (iVar4 == 0) {
    return true;
  }
  iVar4 = (*(this->super_segment)._vptr_segment[0xd])(this);
  if (CONCAT44(extraout_var,iVar4) == 0) {
    return true;
  }
  uVar1 = (this->ph).p_offset;
  uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (this->convertor->need_conversion == false) {
    uVar3 = uVar1;
  }
  uVar11 = (ulong)uVar3;
  paVar5 = (this->translator->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (paVar5 == (this->translator->addr_translations).
                  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00108873:
      iVar4 = (*(this->super_segment)._vptr_segment[0xd])(this);
      uVar6 = CONCAT44(extraout_var_00,iVar4);
      uVar2 = this->stream_size;
      if ((((uVar2 < uVar11) || (uVar2 < uVar6)) || (uVar2 - uVar11 < uVar6)) ||
         (uVar6 == 0xffffffffffffffff)) {
        pcVar10 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl;
      }
      else {
        pcVar7 = (char *)operator_new__(uVar6 + 1,(nothrow_t *)&std::nothrow);
        pcVar10 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl;
        (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl = pcVar7;
        if (pcVar10 != (char *)0x0) {
          operator_delete__(pcVar10);
        }
        std::istream::seekg(this->pstream,uVar11,0);
        pcVar10 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl;
        if (pcVar10 == (char *)0x0) {
          return false;
        }
        plVar8 = (long *)std::istream::read((char *)this->pstream,(long)pcVar10);
        pcVar10 = (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                  super__Head_base<0UL,_char_*,_false>._M_head_impl;
        if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
          pcVar10[uVar6] = '\0';
          this->is_loaded = true;
          return true;
        }
      }
      (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
      if (pcVar10 != (char *)0x0) {
        operator_delete__(pcVar10);
      }
      return false;
    }
    lVar9 = uVar11 - *(long *)paVar5;
    if ((*(long *)paVar5 <= (long)uVar11) && (lVar9 < *(long *)(paVar5 + 0x10))) {
      uVar11 = lVar9 + *(long *)(paVar5 + 0x20);
      goto LAB_00108873;
    }
    paVar5 = paVar5 + 0x30;
  } while( true );
}

Assistant:

bool load_data() const
    {
        if ( PT_NULL == get_type() || 0 == get_file_size() ) {
            return true;
        }

        Elf_Xword p_offset = ( *translator )[( *convertor )( ph.p_offset )];
        Elf_Xword size     = get_file_size();

        // Check for integer overflow in offset calculation
        if (p_offset > get_stream_size()) {
            data = nullptr;
            return false;
        }

        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - p_offset)) {
            data = nullptr;
            return false;
        }

        // Check if size can be safely converted to size_t
        if (size > std::numeric_limits<size_t>::max() - 1) {
            data = nullptr;
            return false;
        }

        data.reset( new ( std::nothrow ) char[(size_t)size + 1] );

        pstream->seekg( p_offset );
        if ( nullptr != data.get() && pstream->read( data.get(), size ) ) {
            data.get()[size] = 0;
        }
        else {
            data = nullptr;
            return false;
        }

        is_loaded = true;

        return true;
    }